

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.hh
# Opt level: O2

void __thiscall
tchecker::
pool_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
::destruct_all(pool_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
               *this)

{
  size_t sVar1;
  char **ppcVar2;
  char **ppcVar3;
  
  ppcVar3 = &this->_block_head;
  do {
    ppcVar3 = (char **)*ppcVar3;
    if (ppcVar3 == (char **)0x0) {
      free_all(this);
      return;
    }
    sVar1 = this->_block_size;
    for (ppcVar2 = ppcVar3 + 1;
        (ppcVar2 != (char **)(sVar1 + (long)ppcVar3) &&
        ((ppcVar2 < this->_raw_head || (this->_raw_end <= ppcVar2))));
        ppcVar2 = (char **)((long)ppcVar2 + this->_alloc_size)) {
      if (*ppcVar2 != (char *)0xffffffffffffffff) {
        if (*ppcVar2 != (char *)0x0) {
          __assert_fail("*refcount == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/pool.hh"
                        ,0x10b,
                        "void tchecker::pool_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t, tchecker::tck_reach::zg_covreach::edge_t>>>::destruct_all() [T = tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t, tchecker::tck_reach::zg_covreach::edge_t>>]"
                       );
        }
        *ppcVar2 = (char *)0xffffffffffffffff;
        tchecker::graph::subsumption::
        edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>::
        ~edge_t((edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>
                 *)(ppcVar2 + 1));
      }
    }
  } while( true );
}

Assistant:

void destruct_all()
  {
    // Call destructor on all chunks in blocks list that
    // - are not in free list
    // - are not in raw block
    for (void * block = _block_head; block != nullptr; block = nextblock(block)) {
      void * block_end = static_cast<char *>(block) + _block_size;

      for (char * chunk = first_chunk_ptr(block); chunk != block_end; chunk += _alloc_size) {
        // Ignore chunks inside unused raw block
        if ((_raw_head <= chunk) && (chunk < _raw_end))
          break;

        // Destruct all chunks that are not free
        typename T::refcount_t * refcount = reinterpret_cast<typename T::refcount_t *>(chunk);

        if (*refcount > T::REFCOUNT_MAX)
          continue;

        assert(*refcount == 0);
        // make the chunk free using its refcount
        *refcount = FREE_CHUNK;
        // destruct the object in the chunk
        T * t = reinterpret_cast<T *>(refcount + 1);
        T::destruct(t); // t->~T();
      }
    }

    // Free memory
    free_all();
  }